

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O2

whisper_context *
whisper_init_with_params_no_state(whisper_model_loader *loader,whisper_context_params params)

{
  whisper_hparams *pwVar1;
  int32_t *piVar2;
  int32_t *piVar3;
  int32_t *piVar4;
  int32_t *piVar5;
  int32_t *piVar6;
  int32_t *piVar7;
  int32_t *piVar8;
  int32_t *piVar9;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  id *piVar10;
  vector<whisper_layer_encoder,_std::allocator<whisper_layer_encoder>_> *this_01;
  vector<whisper_layer_decoder,_std::allocator<whisper_layer_decoder>_> *this_02;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
  *this_03;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  pointer pfVar21;
  pointer pwVar22;
  pointer pwVar23;
  mapped_type pgVar24;
  void *pvVar25;
  _func_size_t_void_ptr_void_ptr_size_t *p_Var26;
  void *pvVar27;
  pointer ppgVar28;
  undefined1 auVar29 [16];
  whisper_context_params wVar30;
  mapped_type mVar31;
  _Alloc_hider _Var32;
  pointer pcVar33;
  bool bVar34;
  char cVar35;
  ggml_type gVar36;
  int iVar37;
  int iVar38;
  undefined8 uVar39;
  whisper_context *this_04;
  long lVar40;
  mapped_type *pmVar41;
  mapped_type *pmVar42;
  mapped_type *pmVar43;
  char *__s;
  ulong uVar44;
  whisper_hparams *pwVar45;
  code *pcVar46;
  ggml_backend_buffer_type **__args_1;
  ggml_tensor *pgVar47;
  long lVar48;
  undefined8 uVar49;
  _Base_ptr p_Var50;
  iterator iVar51;
  mapped_type *ppgVar52;
  size_t sVar53;
  size_type __new_size;
  int *piVar54;
  e_model eVar55;
  long lVar56;
  uint uVar57;
  int i_1;
  long lVar58;
  ggml_backend_buffer **buf_1;
  whisper_model *__k;
  int32_t *piVar59;
  pointer ppgVar60;
  size_t i;
  ulong uVar61;
  long lVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  long local_1c0;
  anon_class_32_4_a9a74eaa create_tensor;
  allocator<char> local_181;
  uint32_t len;
  size_type local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  int32_t *local_160;
  int32_t ne [4];
  vector<char,_std::allocator<char>_> read_buf;
  int32_t ttype;
  int32_t length;
  int32_t n_dims;
  buft_list_t buft_list;
  vector<char,_std::allocator<char>_> tmp_1;
  map<ggml_backend_buffer_type_*,_ggml_context_*,_std::less<ggml_backend_buffer_type_*>,_std::allocator<std::pair<ggml_backend_buffer_type_*const,_ggml_context_*>_>_>
  ctx_map;
  anon_class_24_3_8d92057b get_ctx;
  size_t n_tensors;
  string local_68;
  long local_48;
  undefined8 uStack_40;
  undefined1 local_38;
  
  wVar30 = params;
  ggml_time_init();
  if ((params.flash_attn == 1) &&
     (((undefined1  [48])params & (undefined1  [48])0x1) != (undefined1  [48])0x0)) {
    whisper_log_internal
              (GGML_LOG_LEVEL_WARN,
               "%s: dtw_token_timestamps is not supported with flash_attn - disabling\n",
               "whisper_init_with_params_no_state");
    params.dtw_token_timestamps = false;
  }
  eVar55 = MODEL_BASE;
  whisper_log_internal
            (GGML_LOG_LEVEL_INFO,"%s: use gpu    = %d\n","whisper_init_with_params_no_state",
             (ulong)params.use_gpu);
  whisper_log_internal
            (GGML_LOG_LEVEL_INFO,"%s: flash attn = %d\n","whisper_init_with_params_no_state",
             (ulong)(uint)params.flash_attn);
  whisper_log_internal
            (GGML_LOG_LEVEL_INFO,"%s: gpu_device = %d\n","whisper_init_with_params_no_state",
             (ulong)(uint)params.gpu_device);
  whisper_log_internal
            (GGML_LOG_LEVEL_INFO,"%s: dtw        = %d\n","whisper_init_with_params_no_state",
             (ulong)params.dtw_token_timestamps);
  uVar39 = ggml_backend_dev_count();
  whisper_log_internal
            (GGML_LOG_LEVEL_INFO,"%s: devices    = %zu\n","whisper_init_with_params_no_state",uVar39
            );
  uVar39 = ggml_backend_reg_count();
  whisper_log_internal
            (GGML_LOG_LEVEL_INFO,"%s: backends   = %zu\n","whisper_init_with_params_no_state",uVar39
            );
  this_04 = (whisper_context *)operator_new(0x248);
  whisper_context::whisper_context(this_04);
  uVar39 = wVar30._0_8_;
  (this_04->params).dtw_aheads.heads = params.dtw_aheads.heads;
  (this_04->params).dtw_mem_size = params.dtw_mem_size;
  (this_04->params).dtw_n_top = params.dtw_n_top;
  *(undefined4 *)&(this_04->params).field_0x14 = params._20_4_;
  (this_04->params).dtw_aheads.n_heads = params.dtw_aheads.n_heads;
  (this_04->params).use_gpu = (bool)(char)uVar39;
  (this_04->params).flash_attn = (bool)(char)((ulong)uVar39 >> 8);
  *(short *)&(this_04->params).field_0x2 = (short)((ulong)uVar39 >> 0x10);
  (this_04->params).gpu_device = (int)((ulong)uVar39 >> 0x20);
  (this_04->params).dtw_token_timestamps = params.dtw_token_timestamps;
  *(int3 *)&(this_04->params).field_0x9 = params._9_3_;
  (this_04->params).dtw_aheads_preset = params.dtw_aheads_preset;
  whisper_log_internal(GGML_LOG_LEVEL_INFO,"%s: loading model\n","whisper_model_load");
  lVar40 = ggml_time_us();
  this_04->t_start_us = lVar40;
  (*loader->read)(loader->context,&ctx_map,4);
  if (ctx_map._M_t._M_impl._0_4_ != 0x67676d6c) {
    whisper_log_internal
              (GGML_LOG_LEVEL_ERROR,"%s: invalid model data (bad magic)\n","whisper_model_load");
    goto LAB_00147b84;
  }
  pwVar1 = &(this_04->model).hparams;
  (*loader->read)(loader->context,pwVar1,4);
  piVar59 = &(this_04->model).hparams.n_audio_ctx;
  (*loader->read)(loader->context,piVar59,4);
  piVar2 = &(this_04->model).hparams.n_audio_state;
  (*loader->read)(loader->context,piVar2,4);
  local_160 = &(this_04->model).hparams.n_audio_head;
  (*loader->read)(loader->context,local_160,4);
  piVar3 = &(this_04->model).hparams.n_audio_layer;
  (*loader->read)(loader->context,piVar3,4);
  piVar4 = &(this_04->model).hparams.n_text_ctx;
  (*loader->read)(loader->context,piVar4,4);
  piVar5 = &(this_04->model).hparams.n_text_state;
  (*loader->read)(loader->context,piVar5,4);
  piVar6 = &(this_04->model).hparams.n_text_head;
  (*loader->read)(loader->context,piVar6,4);
  piVar7 = &(this_04->model).hparams.n_text_layer;
  (*loader->read)(loader->context,piVar7,4);
  piVar8 = &(this_04->model).hparams.n_mels;
  (*loader->read)(loader->context,piVar8,4);
  piVar9 = &(this_04->model).hparams.ftype;
  (*loader->read)(loader->context,piVar9,4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ctx_map,"",(allocator<char> *)&create_tensor);
  __k = &this_04->model;
  iVar37 = *piVar3;
  if (iVar37 == 4) {
    eVar55 = MODEL_TINY;
LAB_00146433:
    __k->type = eVar55;
  }
  else {
    if (iVar37 == 6) goto LAB_00146433;
    if (iVar37 == 0xc) {
      eVar55 = MODEL_SMALL;
      goto LAB_00146433;
    }
    if (iVar37 == 0x18) {
      eVar55 = MODEL_MEDIUM;
      goto LAB_00146433;
    }
    if ((iVar37 == 0x20) && (__k->type = MODEL_LARGE, pwVar1->n_vocab == 0xca9a)) {
      std::__cxx11::string::assign((char *)&ctx_map);
    }
  }
  iVar37 = *piVar9;
  uVar61 = (long)iVar37 % 1000;
  *piVar9 = (int32_t)uVar61;
  gVar36 = ggml_ftype_to_ggml_type(uVar61 & 0xffffffff);
  this_04->wtype = gVar36;
  if (gVar36 == GGML_TYPE_COUNT) {
    whisper_log_internal
              (GGML_LOG_LEVEL_ERROR,"%s: invalid model (bad ftype value %d)\n","whisper_model_load",
               (ulong)(uint)*piVar9);
  }
  else {
    whisper_log_internal
              (GGML_LOG_LEVEL_INFO,"%s: n_vocab       = %d\n","whisper_model_load",
               (ulong)(uint)pwVar1->n_vocab);
    whisper_log_internal
              (GGML_LOG_LEVEL_INFO,"%s: n_audio_ctx   = %d\n","whisper_model_load",
               (ulong)(uint)*piVar59);
    whisper_log_internal
              (GGML_LOG_LEVEL_INFO,"%s: n_audio_state = %d\n","whisper_model_load",
               (ulong)(uint)*piVar2);
    whisper_log_internal
              (GGML_LOG_LEVEL_INFO,"%s: n_audio_head  = %d\n","whisper_model_load",
               (ulong)(uint)*local_160);
    whisper_log_internal
              (GGML_LOG_LEVEL_INFO,"%s: n_audio_layer = %d\n","whisper_model_load",
               (ulong)(uint)*piVar3);
    whisper_log_internal
              (GGML_LOG_LEVEL_INFO,"%s: n_text_ctx    = %d\n","whisper_model_load",
               (ulong)(uint)*piVar4);
    whisper_log_internal
              (GGML_LOG_LEVEL_INFO,"%s: n_text_state  = %d\n","whisper_model_load",
               (ulong)(uint)*piVar5);
    whisper_log_internal
              (GGML_LOG_LEVEL_INFO,"%s: n_text_head   = %d\n","whisper_model_load",
               (ulong)(uint)*piVar6);
    whisper_log_internal
              (GGML_LOG_LEVEL_INFO,"%s: n_text_layer  = %d\n","whisper_model_load",
               (ulong)(uint)*piVar7);
    whisper_log_internal
              (GGML_LOG_LEVEL_INFO,"%s: n_mels        = %d\n","whisper_model_load",
               (ulong)(uint)*piVar8);
    whisper_log_internal
              (GGML_LOG_LEVEL_INFO,"%s: ftype         = %d\n","whisper_model_load",
               (ulong)(uint)*piVar9);
    whisper_log_internal
              (GGML_LOG_LEVEL_INFO,"%s: qntvr         = %d\n","whisper_model_load",
               (long)iVar37 / 1000 & 0xffffffff);
    eVar55 = __k->type;
    pmVar41 = std::
              map<e_model,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<e_model>,_std::allocator<std::pair<const_e_model,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::at(&g_model_name_abi_cxx11_,&__k->type);
    whisper_log_internal
              (GGML_LOG_LEVEL_INFO,"%s: type          = %d (%s%s)\n","whisper_model_load",
               (ulong)eVar55,(pmVar41->_M_dataplus)._M_p,ctx_map._M_t._M_impl._0_8_);
  }
  std::__cxx11::string::~string((string *)&ctx_map);
  if (gVar36 == GGML_TYPE_COUNT) {
LAB_00147b84:
    (*loader->close)(loader->context);
    whisper_log_internal
              (GGML_LOG_LEVEL_ERROR,"%s: failed to load model\n","whisper_init_with_params_no_state"
              );
    whisper_context::~whisper_context(this_04);
    operator_delete(this_04,0x248);
    return (whisper_context *)0x0;
  }
  (*loader->read)(loader->context,&(this_04->model).filters,4);
  (*loader->read)(loader->context,&(this_04->model).filters.n_fft,4);
  std::vector<float,_std::allocator<float>_>::resize
            (&(this_04->model).filters.data,
             (long)(this_04->model).filters.n_fft * (long)(this_04->model).filters.n_mel);
  pfVar21 = (this_04->model).filters.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  (*loader->read)(loader->context,pfVar21,
                  (long)(this_04->model).filters.data.
                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pfVar21);
  auVar29._12_4_ = 0;
  auVar29._0_12_ =
       (undefined1  [12])
       buft_list.
       super__Vector_base<std::pair<ggml_backend_device_*,_ggml_backend_buffer_type_*>,_std::allocator<std::pair<ggml_backend_device_*,_ggml_backend_buffer_type_*>_>_>
       ._M_impl.super__Vector_impl_data._4_12_;
  buft_list.
  super__Vector_base<std::pair<ggml_backend_device_*,_ggml_backend_buffer_type_*>,_std::allocator<std::pair<ggml_backend_device_*,_ggml_backend_buffer_type_*>_>_>
  ._M_impl.super__Vector_impl_data._0_16_ = auVar29 << 0x20;
  (*loader->read)(loader->context,&buft_list,4);
  ctx_map._M_t._M_impl._0_8_ = &ctx_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  ctx_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  ctx_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  ctx_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       ((ulong)ctx_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent & 0xffffffffffffff00);
  get_ctx.ctx_map =
       (map<ggml_backend_buffer_type_*,_ggml_context_*,_std::less<ggml_backend_buffer_type_*>,_std::allocator<std::pair<ggml_backend_buffer_type_*const,_ggml_context_*>_>_>
        *)0x0;
  get_ctx.n_tensors = (size_t *)0x0;
  get_ctx.model = (whisper_model *)0x0;
  std::vector<char,_std::allocator<char>_>::reserve
            ((vector<char,_std::allocator<char>_> *)&get_ctx,0x80);
  this = &(this_04->vocab).token_to_id;
  this_00 = &(this_04->vocab).id_to_token;
  iVar37 = 0;
  while( true ) {
    create_tensor.hparams = (whisper_hparams *)CONCAT44(create_tensor.hparams._4_4_,iVar37);
    if ((int)(uint)buft_list.
                   super__Vector_base<std::pair<ggml_backend_device_*,_ggml_backend_buffer_type_*>,_std::allocator<std::pair<ggml_backend_device_*,_ggml_backend_buffer_type_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start <= iVar37) break;
    (*loader->read)(loader->context,&len,4);
    if (((ulong)_len & 0xffffffff) == 0) {
      std::__cxx11::string::assign((char *)&ctx_map);
    }
    else {
      std::vector<char,_std::allocator<char>_>::resize
                ((vector<char,_std::allocator<char>_> *)&get_ctx,(ulong)_len & 0xffffffff);
      (*loader->read)(loader->context,get_ctx.ctx_map,
                      (long)get_ctx.n_tensors - (long)get_ctx.ctx_map);
      std::__cxx11::string::assign((char *)&ctx_map,(ulong)get_ctx.ctx_map);
    }
    mVar31 = (mapped_type)create_tensor.hparams;
    pmVar42 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::operator[](this,(key_type *)&ctx_map);
    *pmVar42 = mVar31;
    pmVar43 = std::
              map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](this_00,(key_type *)&create_tensor);
    std::__cxx11::string::_M_assign((string *)pmVar43);
    iVar37 = (mapped_type)create_tensor.hparams + 1;
  }
  iVar37 = (this_04->model).hparams.n_vocab;
  (this_04->vocab).n_vocab = iVar37;
  if (0xca98 < iVar37) {
    iVar38 = iVar37 + -0xca98;
    uVar11 = (this_04->vocab).token_solm;
    uVar12 = (this_04->vocab).token_prev;
    uVar13 = (this_04->vocab).token_nosp;
    uVar14 = (this_04->vocab).token_not;
    (this_04->vocab).token_eot = (this_04->vocab).token_eot + 1;
    (this_04->vocab).token_sot = (this_04->vocab).token_sot + 1;
    (this_04->vocab).token_translate = (this_04->vocab).token_translate + iVar38;
    (this_04->vocab).token_transcribe = (this_04->vocab).token_transcribe + iVar38;
    (this_04->vocab).token_solm = iVar38 + uVar11;
    (this_04->vocab).token_prev = iVar38 + uVar12;
    (this_04->vocab).token_nosp = iVar38 + uVar13;
    (this_04->vocab).token_not = iVar38 + uVar14;
    piVar10 = &(this_04->vocab).token_beg;
    *piVar10 = *piVar10 + iVar38;
  }
  if ((int)(uint)buft_list.
                 super__Vector_base<std::pair<ggml_backend_device_*,_ggml_backend_buffer_type_*>,_std::allocator<std::pair<ggml_backend_device_*,_ggml_backend_buffer_type_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start < iVar37) {
    whisper_log_internal(GGML_LOG_LEVEL_INFO,"%s: adding %d extra tokens\n","whisper_model_load");
    uVar57 = (uint)buft_list.
                   super__Vector_base<std::pair<ggml_backend_device_*,_ggml_backend_buffer_type_*>,_std::allocator<std::pair<ggml_backend_device_*,_ggml_backend_buffer_type_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      read_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(read_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,uVar57);
      if (pwVar1->n_vocab <= (int)uVar57) break;
      uVar15 = (this_04->vocab).token_beg;
      if (uVar57 - uVar15 == 0 || (int)uVar57 < (int)uVar15) {
        if (((((uVar57 != (this_04->vocab).token_eot) &&
              (uVar16 = (this_04->vocab).token_sot, uVar57 != uVar16)) &&
             (uVar57 != (this_04->vocab).token_translate)) &&
            (((uVar57 != (this_04->vocab).token_transcribe &&
              (uVar57 != (this_04->vocab).token_solm)) &&
             ((uVar57 != (this_04->vocab).token_prev &&
              ((uVar57 != (this_04->vocab).token_nosp && (uVar57 != (this_04->vocab).token_not))))))
            )) && (uVar57 != uVar15)) {
          if (((int)uVar16 < (int)uVar57) &&
             (iVar37 = (this_04->vocab).n_vocab,
             (int)uVar57 <= (int)(((iVar37 + uVar16) - (uint)(0xca98 < iVar37)) + -0xca35))) {
            __s = whisper_lang_str(uVar57 + ~uVar16);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_68,__s,(allocator<char> *)&tmp_1);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&len
                           ,"[_LANG_",&local_68);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &create_tensor,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&len
                           ,"]");
          }
          else {
            std::__cxx11::to_string(&local_68,uVar57);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&len
                           ,"[_extra_token_",&local_68);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &create_tensor,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&len
                           ,"]");
          }
          goto LAB_001468d5;
        }
        std::__cxx11::string::assign((char *)&ctx_map);
      }
      else {
        std::__cxx11::to_string(&local_68,uVar57 - uVar15);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&len,
                       "[_TT_",&local_68);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &create_tensor,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&len,"]"
                      );
LAB_001468d5:
        std::__cxx11::string::operator=((string *)&ctx_map,(string *)&create_tensor);
        std::__cxx11::string::~string((string *)&create_tensor);
        std::__cxx11::string::~string((string *)&len);
        std::__cxx11::string::~string((string *)&local_68);
      }
      mVar31 = (mapped_type)
               read_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pmVar42 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::operator[](this,(key_type *)&ctx_map);
      *pmVar42 = mVar31;
      pmVar43 = std::
                map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](this_00,(key_type *)&read_buf);
      std::__cxx11::string::_M_assign((string *)pmVar43);
      uVar57 = (mapped_type)
               read_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
    }
    iVar37 = (this_04->vocab).n_vocab;
  }
  whisper_log_internal
            (GGML_LOG_LEVEL_INFO,"%s: n_langs       = %d\n","whisper_model_load",
             (ulong)((iVar37 - (uint)(0xca98 < iVar37)) - 0xca35));
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&get_ctx);
  std::__cxx11::string::~string((string *)&ctx_map);
  gVar36 = this_04->wtype;
  n_tensors = (long)(this_04->model).hparams.n_audio_layer * 0xf +
              (long)(this_04->model).hparams.n_text_layer * 0x18 + 0x19;
  ctx_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &ctx_map._M_t._M_impl.super__Rb_tree_header._M_header;
  ctx_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       ctx_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  ctx_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  ctx_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  get_ctx.n_tensors = &n_tensors;
  get_ctx.ctx_map = &ctx_map;
  buft_list.
  super__Vector_base<std::pair<ggml_backend_device_*,_ggml_backend_buffer_type_*>,_std::allocator<std::pair<ggml_backend_device_*,_ggml_backend_buffer_type_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buft_list.
  super__Vector_base<std::pair<ggml_backend_device_*,_ggml_backend_buffer_type_*>,_std::allocator<std::pair<ggml_backend_device_*,_ggml_backend_buffer_type_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  buft_list.
  super__Vector_base<std::pair<ggml_backend_device_*,_ggml_backend_buffer_type_*>,_std::allocator<std::pair<ggml_backend_device_*,_ggml_backend_buffer_type_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ctx_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       ctx_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  get_ctx.model = __k;
  if ((this_04->params).use_gpu == true) {
    iVar37 = 0;
    for (uVar61 = 0; uVar44 = ggml_backend_dev_count(), uVar61 < uVar44; uVar61 = uVar61 + 1) {
      create_tensor.hparams = (whisper_hparams *)ggml_backend_dev_get(uVar61);
      iVar38 = ggml_backend_dev_type(create_tensor.hparams);
      if (iVar38 == 1) {
        iVar38 = (this_04->params).gpu_device;
        if (iVar37 == iVar38 || iVar37 == 0) {
          _len = (pointer)ggml_backend_dev_buffer_type(create_tensor.hparams);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_len !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            std::
            vector<std::pair<ggml_backend_device*,ggml_backend_buffer_type*>,std::allocator<std::pair<ggml_backend_device*,ggml_backend_buffer_type*>>>
            ::emplace_back<ggml_backend_device*&,ggml_backend_buffer_type*&>
                      ((vector<std::pair<ggml_backend_device*,ggml_backend_buffer_type*>,std::allocator<std::pair<ggml_backend_device*,ggml_backend_buffer_type*>>>
                        *)&buft_list,(ggml_backend_device **)&create_tensor,
                       (ggml_backend_buffer_type **)&len);
          }
          iVar38 = (this_04->params).gpu_device;
        }
        if (iVar38 <= iVar37) break;
        iVar37 = iVar37 + 1;
      }
    }
  }
  pwVar45 = (whisper_hparams *)ggml_backend_dev_by_type(0);
  create_tensor.hparams = pwVar45;
  uVar39 = ggml_backend_dev_backend_reg(pwVar45);
  pcVar46 = (code *)ggml_backend_reg_get_proc_address(uVar39,"ggml_backend_dev_get_extra_bufts");
  if (pcVar46 != (code *)0x0) {
    __args_1 = (ggml_backend_buffer_type **)(*pcVar46)(pwVar45);
    for (; (__args_1 != (ggml_backend_buffer_type **)0x0 &&
           (*__args_1 != (ggml_backend_buffer_type *)0x0)); __args_1 = __args_1 + 1) {
      std::
      vector<std::pair<ggml_backend_device*,ggml_backend_buffer_type*>,std::allocator<std::pair<ggml_backend_device*,ggml_backend_buffer_type*>>>
      ::emplace_back<ggml_backend_device*&,ggml_backend_buffer_type*&>
                ((vector<std::pair<ggml_backend_device*,ggml_backend_buffer_type*>,std::allocator<std::pair<ggml_backend_device*,ggml_backend_buffer_type*>>>
                  *)&buft_list,(ggml_backend_device **)&create_tensor,__args_1);
    }
  }
  _len = (pointer)ggml_backend_cpu_buffer_type();
  std::
  vector<std::pair<ggml_backend_device*,ggml_backend_buffer_type*>,std::allocator<std::pair<ggml_backend_device*,ggml_backend_buffer_type*>>>
  ::emplace_back<ggml_backend_device*&,ggml_backend_buffer_type*>
            ((vector<std::pair<ggml_backend_device*,ggml_backend_buffer_type*>,std::allocator<std::pair<ggml_backend_device*,ggml_backend_buffer_type*>>>
              *)&buft_list,(ggml_backend_device **)&create_tensor,(ggml_backend_buffer_type **)&len)
  ;
  sVar53 = n_tensors;
  create_tensor.hparams = pwVar1;
  create_tensor.buft_list = &buft_list;
  create_tensor.get_ctx = &get_ctx;
  create_tensor.model = __k;
  local_48 = ggml_tensor_overhead();
  local_48 = local_48 * sVar53;
  uStack_40 = 0;
  local_38 = 1;
  uVar39 = ggml_init();
  iVar37 = (this_04->model).hparams.n_vocab;
  iVar38 = (this_04->model).hparams.n_audio_ctx;
  iVar17 = (this_04->model).hparams.n_audio_state;
  lVar62 = (long)iVar17;
  uVar57 = (this_04->model).hparams.n_audio_layer;
  local_160 = (int32_t *)(ulong)uVar57;
  iVar18 = (this_04->model).hparams.n_text_ctx;
  iVar19 = (this_04->model).hparams.n_text_state;
  lVar58 = (long)iVar19;
  uVar15 = (this_04->model).hparams.n_text_layer;
  iVar20 = (this_04->model).hparams.n_mels;
  this_01 = &(this_04->model).layers_encoder;
  std::vector<whisper_layer_encoder,_std::allocator<whisper_layer_encoder>_>::resize
            (this_01,(long)(int)uVar57);
  this_02 = &(this_04->model).layers_decoder;
  std::vector<whisper_layer_decoder,_std::allocator<whisper_layer_decoder>_>::resize
            (this_02,(long)(int)uVar15);
  pgVar47 = (ggml_tensor *)ggml_new_tensor_2d(uVar39,0,lVar62,(long)iVar38);
  pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                      (&create_tensor,ASR_TENSOR_ENC_POS_EMBD,ASR_SYSTEM_ENCODER,pgVar47,0);
  (this_04->model).e_pe = pgVar47;
  pgVar47 = (ggml_tensor *)ggml_new_tensor_3d(uVar39,gVar36 != GGML_TYPE_F32,3,(long)iVar20);
  pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                      (&create_tensor,ASR_TENSOR_CONV1_WEIGHT,ASR_SYSTEM_ENCODER,pgVar47,0);
  (this_04->model).e_conv_1_w = pgVar47;
  pgVar47 = (ggml_tensor *)ggml_new_tensor_2d(uVar39,0,1,lVar62);
  pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                      (&create_tensor,ASR_TENSOR_CONV1_BIAS,ASR_SYSTEM_ENCODER,pgVar47,0);
  (this_04->model).e_conv_1_b = pgVar47;
  pgVar47 = (ggml_tensor *)ggml_new_tensor_3d(uVar39,gVar36 != GGML_TYPE_F32,3,lVar62);
  pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                      (&create_tensor,ASR_TENSOR_CONV2_WEIGHT,ASR_SYSTEM_ENCODER,pgVar47,0);
  (this_04->model).e_conv_2_w = pgVar47;
  pgVar47 = (ggml_tensor *)ggml_new_tensor_2d(uVar39,0,1,lVar62);
  pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                      (&create_tensor,ASR_TENSOR_CONV2_BIAS,ASR_SYSTEM_ENCODER,pgVar47,0);
  (this_04->model).e_conv_2_b = pgVar47;
  pgVar47 = (ggml_tensor *)ggml_new_tensor_1d(uVar39,0,lVar62);
  pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                      (&create_tensor,ASR_TENSOR_LN_WEIGHT,ASR_SYSTEM_ENCODER,pgVar47,0);
  (this_04->model).e_ln_w = pgVar47;
  pgVar47 = (ggml_tensor *)ggml_new_tensor_1d(uVar39,0,lVar62);
  piVar59 = (int32_t *)0x0;
  pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                      (&create_tensor,ASR_TENSOR_LN_POST_BIAS,ASR_SYSTEM_ENCODER,pgVar47,0);
  (this_04->model).e_ln_b = pgVar47;
  lVar48 = (long)(iVar17 * 4);
  iVar38 = (int)local_160;
  local_160 = (int32_t *)((ulong)local_160 & 0xffffffff);
  if (iVar38 < 1) {
    local_160 = piVar59;
  }
  lVar56 = 0x70;
  for (; iVar38 = (int)piVar59, local_160 != piVar59; piVar59 = (int32_t *)((long)piVar59 + 1)) {
    pwVar22 = (this_01->
              super__Vector_base<whisper_layer_encoder,_std::allocator<whisper_layer_encoder>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pgVar47 = (ggml_tensor *)ggml_new_tensor_1d(uVar39,0,lVar62);
    pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                        (&create_tensor,ASR_TENSOR_MLP_LN_WEIGHT,ASR_SYSTEM_ENCODER,pgVar47,iVar38);
    *(ggml_tensor **)((long)pwVar22 + lVar56 + -0x28) = pgVar47;
    pgVar47 = (ggml_tensor *)ggml_new_tensor_1d(uVar39,0,lVar62);
    pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                        (&create_tensor,ASR_TENSOR_MLP_LN_BIAS,ASR_SYSTEM_ENCODER,pgVar47,iVar38);
    *(ggml_tensor **)((long)pwVar22 + lVar56 + -0x20) = pgVar47;
    pgVar47 = (ggml_tensor *)ggml_new_tensor_2d(uVar39,gVar36,lVar62,lVar48);
    pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                        (&create_tensor,ASR_TENSOR_MLP_0_WEIGHT,ASR_SYSTEM_ENCODER,pgVar47,iVar38);
    *(ggml_tensor **)((long)pwVar22 + lVar56 + -0x18) = pgVar47;
    pgVar47 = (ggml_tensor *)ggml_new_tensor_1d(uVar39,0,lVar48);
    pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                        (&create_tensor,ASR_TENSOR_MLP_0_BIAS,ASR_SYSTEM_ENCODER,pgVar47,iVar38);
    *(ggml_tensor **)((long)pwVar22 + lVar56 + -0x10) = pgVar47;
    pgVar47 = (ggml_tensor *)ggml_new_tensor_2d(uVar39,gVar36,lVar48,lVar62);
    pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                        (&create_tensor,ASR_TENSOR_MLP_2_WEIGHT,ASR_SYSTEM_ENCODER,pgVar47,iVar38);
    *(ggml_tensor **)((long)pwVar22 + lVar56 + -8) = pgVar47;
    pgVar47 = (ggml_tensor *)ggml_new_tensor_1d(uVar39,0,lVar62);
    pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                        (&create_tensor,ASR_TENSOR_MLP_2_BIAS,ASR_SYSTEM_ENCODER,pgVar47,iVar38);
    *(ggml_tensor **)((long)&pwVar22->attn_ln_0_w + lVar56) = pgVar47;
    pgVar47 = (ggml_tensor *)ggml_new_tensor_1d(uVar39,0,lVar62);
    pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                        (&create_tensor,ASR_TENSOR_ATTN_LN_WEIGHT,ASR_SYSTEM_ENCODER,pgVar47,iVar38)
    ;
    *(ggml_tensor **)((long)pwVar22 + lVar56 + -0x70) = pgVar47;
    pgVar47 = (ggml_tensor *)ggml_new_tensor_1d(uVar39,0,lVar62);
    pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                        (&create_tensor,ASR_TENSOR_ATTN_LN_BIAS,ASR_SYSTEM_ENCODER,pgVar47,iVar38);
    *(ggml_tensor **)((long)pwVar22 + lVar56 + -0x68) = pgVar47;
    pgVar47 = (ggml_tensor *)ggml_new_tensor_2d(uVar39,gVar36,lVar62,lVar62);
    pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                        (&create_tensor,ASR_TENSOR_ATTN_QUERY_WEIGHT,ASR_SYSTEM_ENCODER,pgVar47,
                         iVar38);
    *(ggml_tensor **)((long)pwVar22 + lVar56 + -0x50) = pgVar47;
    pgVar47 = (ggml_tensor *)ggml_new_tensor_1d(uVar39,0,lVar62);
    pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                        (&create_tensor,ASR_TENSOR_ATTN_QUERY_BIAS,ASR_SYSTEM_ENCODER,pgVar47,iVar38
                        );
    *(ggml_tensor **)((long)pwVar22 + lVar56 + -0x48) = pgVar47;
    pgVar47 = (ggml_tensor *)ggml_new_tensor_2d(uVar39,gVar36,lVar62,lVar62);
    pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                        (&create_tensor,ASR_TENSOR_ATTN_KEY_WEIGHT,ASR_SYSTEM_ENCODER,pgVar47,iVar38
                        );
    *(ggml_tensor **)((long)pwVar22 + lVar56 + -0x40) = pgVar47;
    pgVar47 = (ggml_tensor *)ggml_new_tensor_2d(uVar39,gVar36,lVar62,lVar62);
    pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                        (&create_tensor,ASR_TENSOR_ATTN_VALUE_WEIGHT,ASR_SYSTEM_ENCODER,pgVar47,
                         iVar38);
    *(ggml_tensor **)((long)pwVar22 + lVar56 + -0x38) = pgVar47;
    pgVar47 = (ggml_tensor *)ggml_new_tensor_1d(uVar39,0,lVar62);
    pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                        (&create_tensor,ASR_TENSOR_ATTN_VALUE_BIAS,ASR_SYSTEM_ENCODER,pgVar47,iVar38
                        );
    *(ggml_tensor **)((long)pwVar22 + lVar56 + -0x30) = pgVar47;
    pgVar47 = (ggml_tensor *)ggml_new_tensor_2d(uVar39,gVar36,lVar62,lVar62);
    pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                        (&create_tensor,ASR_TENSOR_ATTN_OUT_WEIGHT,ASR_SYSTEM_ENCODER,pgVar47,iVar38
                        );
    *(ggml_tensor **)((long)pwVar22 + lVar56 + -0x60) = pgVar47;
    pgVar47 = (ggml_tensor *)ggml_new_tensor_1d(uVar39,0,lVar62);
    pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                        (&create_tensor,ASR_TENSOR_ATTN_OUT_BIAS,ASR_SYSTEM_ENCODER,pgVar47,iVar38);
    *(ggml_tensor **)((long)pwVar22 + lVar56 + -0x58) = pgVar47;
    lVar56 = lVar56 + 0x78;
  }
  pgVar47 = (ggml_tensor *)ggml_new_tensor_2d(uVar39,0,lVar58,(long)iVar18);
  pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                      (&create_tensor,ASR_TENSOR_DEC_POS_EMBD,ASR_SYSTEM_DECODER,pgVar47,0);
  (this_04->model).d_pe = pgVar47;
  pgVar47 = (ggml_tensor *)ggml_new_tensor_2d(uVar39,gVar36,lVar58,(long)iVar37);
  pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                      (&create_tensor,ASR_TENSOR_DEC_TOKEN_EMBD_WEIGHT,ASR_SYSTEM_DECODER,pgVar47,0)
  ;
  (this_04->model).d_te = pgVar47;
  pgVar47 = (ggml_tensor *)ggml_new_tensor_1d(uVar39,0,lVar58);
  pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                      (&create_tensor,ASR_TENSOR_LN_WEIGHT,ASR_SYSTEM_DECODER,pgVar47,0);
  (this_04->model).d_ln_w = pgVar47;
  pgVar47 = (ggml_tensor *)ggml_new_tensor_1d(uVar39,0,lVar58);
  uVar44 = 0;
  pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                      (&create_tensor,ASR_TENSOR_LN_BIAS,ASR_SYSTEM_DECODER,pgVar47,0);
  (this_04->model).d_ln_b = pgVar47;
  uVar61 = (ulong)uVar15;
  if ((int)uVar15 < 1) {
    uVar61 = uVar44;
  }
  lVar48 = (long)(iVar19 * 4);
  lVar62 = 0xb8;
  for (; uVar61 != uVar44; uVar44 = uVar44 + 1) {
    pwVar23 = (this_02->
              super__Vector_base<whisper_layer_decoder,_std::allocator<whisper_layer_decoder>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pgVar47 = (ggml_tensor *)ggml_new_tensor_1d(uVar39,0,lVar58);
    iVar37 = (int)uVar44;
    pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                        (&create_tensor,ASR_TENSOR_MLP_LN_WEIGHT,ASR_SYSTEM_DECODER,pgVar47,iVar37);
    *(ggml_tensor **)((long)pwVar23 + lVar62 + -0x28) = pgVar47;
    pgVar47 = (ggml_tensor *)ggml_new_tensor_1d(uVar39,0,lVar58);
    pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                        (&create_tensor,ASR_TENSOR_MLP_LN_BIAS,ASR_SYSTEM_DECODER,pgVar47,iVar37);
    *(ggml_tensor **)((long)pwVar23 + lVar62 + -0x20) = pgVar47;
    pgVar47 = (ggml_tensor *)ggml_new_tensor_2d(uVar39,gVar36,lVar58,lVar48);
    pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                        (&create_tensor,ASR_TENSOR_MLP_0_WEIGHT,ASR_SYSTEM_DECODER,pgVar47,iVar37);
    *(ggml_tensor **)((long)pwVar23 + lVar62 + -0x18) = pgVar47;
    pgVar47 = (ggml_tensor *)ggml_new_tensor_1d(uVar39,0,lVar48);
    pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                        (&create_tensor,ASR_TENSOR_MLP_0_BIAS,ASR_SYSTEM_DECODER,pgVar47,iVar37);
    *(ggml_tensor **)((long)pwVar23 + lVar62 + -0x10) = pgVar47;
    pgVar47 = (ggml_tensor *)ggml_new_tensor_2d(uVar39,gVar36,lVar48,lVar58);
    pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                        (&create_tensor,ASR_TENSOR_MLP_2_WEIGHT,ASR_SYSTEM_DECODER,pgVar47,iVar37);
    *(ggml_tensor **)((long)pwVar23 + lVar62 + -8) = pgVar47;
    pgVar47 = (ggml_tensor *)ggml_new_tensor_1d(uVar39,0,lVar58);
    pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                        (&create_tensor,ASR_TENSOR_MLP_2_BIAS,ASR_SYSTEM_DECODER,pgVar47,iVar37);
    *(ggml_tensor **)((long)&pwVar23->attn_ln_0_w + lVar62) = pgVar47;
    pgVar47 = (ggml_tensor *)ggml_new_tensor_1d(uVar39,0,lVar58);
    pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                        (&create_tensor,ASR_TENSOR_ATTN_LN_WEIGHT,ASR_SYSTEM_DECODER,pgVar47,iVar37)
    ;
    *(ggml_tensor **)((long)pwVar23 + lVar62 + -0xb8) = pgVar47;
    pgVar47 = (ggml_tensor *)ggml_new_tensor_1d(uVar39,0,lVar58);
    pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                        (&create_tensor,ASR_TENSOR_ATTN_LN_BIAS,ASR_SYSTEM_DECODER,pgVar47,iVar37);
    *(ggml_tensor **)((long)pwVar23 + lVar62 + -0xb0) = pgVar47;
    pgVar47 = (ggml_tensor *)ggml_new_tensor_2d(uVar39,gVar36,lVar58,lVar58);
    pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                        (&create_tensor,ASR_TENSOR_ATTN_QUERY_WEIGHT,ASR_SYSTEM_DECODER,pgVar47,
                         iVar37);
    *(ggml_tensor **)((long)pwVar23 + lVar62 + -0x98) = pgVar47;
    pgVar47 = (ggml_tensor *)ggml_new_tensor_1d(uVar39,0,lVar58);
    pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                        (&create_tensor,ASR_TENSOR_ATTN_QUERY_BIAS,ASR_SYSTEM_DECODER,pgVar47,iVar37
                        );
    *(ggml_tensor **)((long)pwVar23 + lVar62 + -0x90) = pgVar47;
    pgVar47 = (ggml_tensor *)ggml_new_tensor_2d(uVar39,gVar36,lVar58,lVar58);
    pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                        (&create_tensor,ASR_TENSOR_ATTN_KEY_WEIGHT,ASR_SYSTEM_DECODER,pgVar47,iVar37
                        );
    *(ggml_tensor **)((long)pwVar23 + lVar62 + -0x88) = pgVar47;
    pgVar47 = (ggml_tensor *)ggml_new_tensor_2d(uVar39,gVar36,lVar58,lVar58);
    pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                        (&create_tensor,ASR_TENSOR_ATTN_VALUE_WEIGHT,ASR_SYSTEM_DECODER,pgVar47,
                         iVar37);
    *(ggml_tensor **)((long)pwVar23 + lVar62 + -0x80) = pgVar47;
    pgVar47 = (ggml_tensor *)ggml_new_tensor_1d(uVar39,0,lVar58);
    pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                        (&create_tensor,ASR_TENSOR_ATTN_VALUE_BIAS,ASR_SYSTEM_DECODER,pgVar47,iVar37
                        );
    *(ggml_tensor **)((long)pwVar23 + lVar62 + -0x78) = pgVar47;
    pgVar47 = (ggml_tensor *)ggml_new_tensor_2d(uVar39,gVar36,lVar58,lVar58);
    pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                        (&create_tensor,ASR_TENSOR_ATTN_OUT_WEIGHT,ASR_SYSTEM_DECODER,pgVar47,iVar37
                        );
    *(ggml_tensor **)((long)pwVar23 + lVar62 + -0xa8) = pgVar47;
    pgVar47 = (ggml_tensor *)ggml_new_tensor_1d(uVar39,0,lVar58);
    pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                        (&create_tensor,ASR_TENSOR_ATTN_OUT_BIAS,ASR_SYSTEM_DECODER,pgVar47,iVar37);
    *(ggml_tensor **)((long)pwVar23 + lVar62 + -0xa0) = pgVar47;
    pgVar47 = (ggml_tensor *)ggml_new_tensor_1d(uVar39,0,lVar58);
    pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                        (&create_tensor,ASR_TENSOR_ATTN_LN_WEIGHT,ASR_SYSTEM_CROSS,pgVar47,iVar37);
    *(ggml_tensor **)((long)pwVar23 + lVar62 + -0x70) = pgVar47;
    pgVar47 = (ggml_tensor *)ggml_new_tensor_1d(uVar39,0,lVar58);
    pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                        (&create_tensor,ASR_TENSOR_ATTN_LN_BIAS,ASR_SYSTEM_CROSS,pgVar47,iVar37);
    *(ggml_tensor **)((long)pwVar23 + lVar62 + -0x68) = pgVar47;
    pgVar47 = (ggml_tensor *)ggml_new_tensor_2d(uVar39,gVar36,lVar58,lVar58);
    pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                        (&create_tensor,ASR_TENSOR_ATTN_QUERY_WEIGHT,ASR_SYSTEM_CROSS,pgVar47,iVar37
                        );
    *(ggml_tensor **)((long)pwVar23 + lVar62 + -0x50) = pgVar47;
    pgVar47 = (ggml_tensor *)ggml_new_tensor_1d(uVar39,0,lVar58);
    pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                        (&create_tensor,ASR_TENSOR_ATTN_QUERY_BIAS,ASR_SYSTEM_CROSS,pgVar47,iVar37);
    *(ggml_tensor **)((long)pwVar23 + lVar62 + -0x48) = pgVar47;
    pgVar47 = (ggml_tensor *)ggml_new_tensor_2d(uVar39,gVar36,lVar58,lVar58);
    pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                        (&create_tensor,ASR_TENSOR_ATTN_KEY_WEIGHT,ASR_SYSTEM_CROSS,pgVar47,iVar37);
    *(ggml_tensor **)((long)pwVar23 + lVar62 + -0x40) = pgVar47;
    pgVar47 = (ggml_tensor *)ggml_new_tensor_2d(uVar39,gVar36,lVar58,lVar58);
    pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                        (&create_tensor,ASR_TENSOR_ATTN_VALUE_WEIGHT,ASR_SYSTEM_CROSS,pgVar47,iVar37
                        );
    *(ggml_tensor **)((long)pwVar23 + lVar62 + -0x38) = pgVar47;
    pgVar47 = (ggml_tensor *)ggml_new_tensor_1d(uVar39,0,lVar58);
    pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                        (&create_tensor,ASR_TENSOR_ATTN_VALUE_BIAS,ASR_SYSTEM_CROSS,pgVar47,iVar37);
    *(ggml_tensor **)((long)pwVar23 + lVar62 + -0x30) = pgVar47;
    pgVar47 = (ggml_tensor *)ggml_new_tensor_2d(uVar39,gVar36,lVar58,lVar58);
    pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                        (&create_tensor,ASR_TENSOR_ATTN_OUT_WEIGHT,ASR_SYSTEM_CROSS,pgVar47,iVar37);
    *(ggml_tensor **)((long)pwVar23 + lVar62 + -0x60) = pgVar47;
    pgVar47 = (ggml_tensor *)ggml_new_tensor_1d(uVar39,0,lVar58);
    pgVar47 = whisper_model_load::anon_class_32_4_a9a74eaa::operator()
                        (&create_tensor,ASR_TENSOR_ATTN_OUT_BIAS,ASR_SYSTEM_CROSS,pgVar47,iVar37);
    *(ggml_tensor **)((long)pwVar23 + lVar62 + -0x58) = pgVar47;
    lVar62 = lVar62 + 0xc0;
  }
  ggml_free(uVar39);
  for (p_Var50 = ctx_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var50 != &ctx_map._M_t._M_impl.super__Rb_tree_header;
      p_Var50 = (_Base_ptr)std::_Rb_tree_increment(p_Var50)) {
    _len = (pointer)ggml_backend_alloc_ctx_tensors_from_buft
                              (p_Var50[1]._M_parent,*(undefined8 *)(p_Var50 + 1));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_len !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::vector<ggml_backend_buffer*,std::allocator<ggml_backend_buffer*>>::
      emplace_back<ggml_backend_buffer*&>
                ((vector<ggml_backend_buffer*,std::allocator<ggml_backend_buffer*>> *)
                 &(this_04->model).buffers,(ggml_backend_buffer **)&len);
      uVar39 = ggml_backend_buffer_get_size(_len);
      uVar49 = ggml_backend_buffer_name(_len);
      auVar63._8_4_ = (int)((ulong)uVar39 >> 0x20);
      auVar63._0_8_ = uVar39;
      auVar63._12_4_ = 0x45300000;
      whisper_log_internal
                (GGML_LOG_LEVEL_INFO,"%s: %12s total size = %8.2f MB\n",
                 ((auVar63._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar39) - 4503599627370496.0)) / 1000000.0,
                 "whisper_model_load",uVar49);
    }
  }
  (this_04->model).n_loaded = 0;
  read_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  read_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  read_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  this_03 = &(this_04->model).tensors;
  local_1c0 = 0;
  while( true ) {
    (*loader->read)(loader->context,&n_dims,4);
    (*loader->read)(loader->context,&length,4);
    (*loader->read)(loader->context,&ttype,4);
    bVar34 = (*loader->eof)(loader->context);
    if (bVar34) break;
    ne[0] = 1;
    ne[1] = 1;
    ne[2] = 1;
    ne[3] = 1;
    piVar54 = ne;
    iVar37 = 1;
    for (lVar48 = 0; lVar48 < n_dims; lVar48 = lVar48 + 1) {
      (*loader->read)(loader->context,piVar54,4);
      iVar37 = iVar37 * *piVar54;
      piVar54 = piVar54 + 1;
    }
    _len = (pointer)&local_170;
    local_178 = 0;
    local_170._M_local_buf[0] = '\0';
    std::vector<char,_std::allocator<char>_>::vector
              (&tmp_1,(long)length,(allocator_type *)&local_68);
    (*loader->read)(loader->context,
                    tmp_1.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)tmp_1.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)tmp_1.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
    std::__cxx11::string::assign
              ((char *)&len,
               (ulong)tmp_1.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    iVar51 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
             ::find(&this_03->_M_t,(key_type *)&len);
    if ((_Rb_tree_header *)iVar51._M_node ==
        &(this_04->model).tensors._M_t._M_impl.super__Rb_tree_header) {
      whisper_log_internal
                (GGML_LOG_LEVEL_ERROR,"%s: unknown tensor \'%s\' in model file\n",
                 "whisper_model_load",_len);
LAB_00147b41:
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&tmp_1.super__Vector_base<char,_std::allocator<char>_>);
      std::__cxx11::string::~string((string *)&len);
      goto LAB_00147b5d;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,_len,&local_181);
    ppgVar52 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
               ::operator[](this_03,&local_68);
    pgVar24 = *ppgVar52;
    std::__cxx11::string::~string((string *)&local_68);
    lVar48 = ggml_nelements(pgVar24);
    if (lVar48 != iVar37) {
      whisper_log_internal
                (GGML_LOG_LEVEL_ERROR,"%s: tensor \'%s\' has wrong size in model file\n",
                 "whisper_model_load",_len);
      whisper_log_internal
                (GGML_LOG_LEVEL_ERROR,"%s: shape: [%d, %d, %d], expected: [%d, %d, %d]\n",
                 "whisper_model_load",ne._0_8_ & 0xffffffff,(ulong)ne._0_8_ >> 0x20,
                 ne._8_8_ & 0xffffffff,(ulong)(uint)pgVar24->ne[0],(ulong)(uint)pgVar24->ne[1],
                 (ulong)(uint)pgVar24->ne[2]);
      goto LAB_00147b41;
    }
    if (((pgVar24->ne[0] != (long)ne[0]) || (pgVar24->ne[1] != (long)ne[1])) ||
       (pgVar24->ne[2] != (long)ne[2])) {
      whisper_log_internal
                (GGML_LOG_LEVEL_ERROR,
                 "%s: tensor \'%s\' has wrong shape in model file: got [%d, %d, %d], expected [%d, %d, %d]\n"
                 ,"whisper_model_load",_len,pgVar24->ne[0],pgVar24->ne[1],
                 (ulong)(uint)pgVar24->ne[2],(long)ne[0],(ulong)(uint)ne[1],ne._8_8_ & 0xffffffff);
      goto LAB_00147b41;
    }
    lVar58 = ggml_type_size(ttype);
    uVar61 = ggml_blck_size(pgVar24->type);
    uVar44 = ggml_nbytes(pgVar24);
    _Var32._M_p = _len;
    if ((ulong)(lVar58 * lVar48) / uVar61 != uVar44) {
      uVar39 = ggml_nbytes(pgVar24);
      whisper_log_internal
                (GGML_LOG_LEVEL_ERROR,
                 "%s: tensor \'%s\' has wrong size in model file: got %zu, expected %zu\n",
                 "whisper_model_load",_Var32._M_p,uVar39,lVar58 * lVar48);
      goto LAB_00147b41;
    }
    cVar35 = ggml_backend_buffer_is_host(pgVar24->buffer);
    if (cVar35 == '\0') {
      __new_size = ggml_nbytes(pgVar24);
      std::vector<char,_std::allocator<char>_>::resize(&read_buf,__new_size);
      (*loader->read)(loader->context,
                      read_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)read_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)read_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
      pcVar33 = read_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar39 = ggml_nbytes(pgVar24);
      ggml_backend_tensor_set(pgVar24,pcVar33,0,uVar39);
    }
    else {
      pvVar25 = loader->context;
      p_Var26 = loader->read;
      pvVar27 = pgVar24->data;
      sVar53 = ggml_nbytes(pgVar24);
      (*p_Var26)(pvVar25,pvVar27,sVar53);
    }
    lVar48 = ggml_nbytes(pgVar24);
    local_1c0 = local_1c0 + lVar48;
    piVar54 = &(this_04->model).n_loaded;
    *piVar54 = *piVar54 + 1;
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&tmp_1.super__Vector_base<char,_std::allocator<char>_>);
    std::__cxx11::string::~string((string *)&len);
  }
  auVar64._0_8_ = (double)CONCAT44(0x43300000,(int)local_1c0);
  auVar64._8_4_ = (int)((ulong)local_1c0 >> 0x20);
  auVar64._12_4_ = 0x45300000;
  whisper_log_internal
            (GGML_LOG_LEVEL_INFO,"%s: model size    = %7.2f MB\n",
             ((auVar64._8_8_ - 1.9342813113834067e+25) + (auVar64._0_8_ - 4503599627370496.0)) /
             1000000.0,"whisper_model_load");
  iVar37 = (this_04->model).n_loaded;
  if (iVar37 == 0) {
    whisper_log_internal
              (GGML_LOG_LEVEL_WARN,
               "%s: WARN no tensors loaded from model file - assuming empty model for testing\n",
               "whisper_model_load");
  }
  else if (iVar37 != (int)(this_04->model).tensors._M_t._M_impl.super__Rb_tree_header._M_node_count)
  {
    whisper_log_internal
              (GGML_LOG_LEVEL_ERROR,
               "%s: ERROR not all tensors loaded from model file - expected %zu, got %d\n",
               "whisper_model_load");
LAB_00147b5d:
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&read_buf.super__Vector_base<char,_std::allocator<char>_>);
    std::
    _Vector_base<std::pair<ggml_backend_device_*,_ggml_backend_buffer_type_*>,_std::allocator<std::pair<ggml_backend_device_*,_ggml_backend_buffer_type_*>_>_>
    ::~_Vector_base(&buft_list.
                     super__Vector_base<std::pair<ggml_backend_device_*,_ggml_backend_buffer_type_*>,_std::allocator<std::pair<ggml_backend_device_*,_ggml_backend_buffer_type_*>_>_>
                   );
    std::
    _Rb_tree<ggml_backend_buffer_type_*,_std::pair<ggml_backend_buffer_type_*const,_ggml_context_*>,_std::_Select1st<std::pair<ggml_backend_buffer_type_*const,_ggml_context_*>_>,_std::less<ggml_backend_buffer_type_*>,_std::allocator<std::pair<ggml_backend_buffer_type_*const,_ggml_context_*>_>_>
    ::~_Rb_tree(&ctx_map._M_t);
    goto LAB_00147b84;
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&read_buf.super__Vector_base<char,_std::allocator<char>_>);
  ppgVar28 = (this_04->model).buffers.
             super__Vector_base<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  for (ppgVar60 = (this_04->model).buffers.
                  super__Vector_base<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppgVar60 != ppgVar28;
      ppgVar60 = ppgVar60 + 1) {
    ggml_backend_buffer_set_usage(*ppgVar60,1);
  }
  lVar48 = ggml_time_us();
  this_04->t_load_us = lVar48 - lVar40;
  std::
  _Vector_base<std::pair<ggml_backend_device_*,_ggml_backend_buffer_type_*>,_std::allocator<std::pair<ggml_backend_device_*,_ggml_backend_buffer_type_*>_>_>
  ::~_Vector_base(&buft_list.
                   super__Vector_base<std::pair<ggml_backend_device_*,_ggml_backend_buffer_type_*>,_std::allocator<std::pair<ggml_backend_device_*,_ggml_backend_buffer_type_*>_>_>
                 );
  std::
  _Rb_tree<ggml_backend_buffer_type_*,_std::pair<ggml_backend_buffer_type_*const,_ggml_context_*>,_std::_Select1st<std::pair<ggml_backend_buffer_type_*const,_ggml_context_*>_>,_std::less<ggml_backend_buffer_type_*>,_std::allocator<std::pair<ggml_backend_buffer_type_*const,_ggml_context_*>_>_>
  ::~_Rb_tree(&ctx_map._M_t);
  (*loader->close)(loader->context);
  return this_04;
}

Assistant:

struct whisper_context * whisper_init_with_params_no_state(struct whisper_model_loader * loader, struct whisper_context_params params) {
    ggml_time_init();

    if (params.flash_attn && params.dtw_token_timestamps) {
        WHISPER_LOG_WARN("%s: dtw_token_timestamps is not supported with flash_attn - disabling\n", __func__);
        params.dtw_token_timestamps = false;
    }

    WHISPER_LOG_INFO("%s: use gpu    = %d\n", __func__, params.use_gpu);
    WHISPER_LOG_INFO("%s: flash attn = %d\n", __func__, params.flash_attn);
    WHISPER_LOG_INFO("%s: gpu_device = %d\n", __func__, params.gpu_device);
    WHISPER_LOG_INFO("%s: dtw        = %d\n", __func__, params.dtw_token_timestamps);
    WHISPER_LOG_INFO("%s: devices    = %zu\n", __func__, ggml_backend_dev_count());
    WHISPER_LOG_INFO("%s: backends   = %zu\n", __func__, ggml_backend_reg_count());

    whisper_context * ctx = new whisper_context;
    ctx->params = params;

    if (!whisper_model_load(loader, *ctx)) {
        loader->close(loader->context);
        WHISPER_LOG_ERROR("%s: failed to load model\n", __func__);
        delete ctx;
        return nullptr;
    }

    loader->close(loader->context);

    return ctx;
}